

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

bool __thiscall booster::locale::date_time::operator==(date_time *this,date_time *other)

{
  int iVar1;
  abstract_calendar *paVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  hold_ptr<booster::locale::abstract_calendar> *in_RSI;
  hold_ptr<booster::locale::abstract_calendar> *in_RDI;
  posix_time local_30;
  posix_time local_20;
  hold_ptr<booster::locale::abstract_calendar> *local_10;
  
  local_10 = in_RSI;
  paVar2 = hold_ptr<booster::locale::abstract_calendar>::operator->(in_RDI);
  iVar1 = (*paVar2->_vptr_abstract_calendar[5])();
  local_20.seconds = CONCAT44(extraout_var,iVar1);
  paVar2 = hold_ptr<booster::locale::abstract_calendar>::operator->(local_10);
  iVar1 = (*paVar2->_vptr_abstract_calendar[5])();
  local_30.seconds = CONCAT44(extraout_var_00,iVar1);
  iVar1 = anon_unknown_9::compare(&local_20,&local_30);
  return iVar1 == 0;
}

Assistant:

bool date_time::operator==(date_time const &other) const
{
    return compare(impl_->get_time(),other.impl_->get_time()) == 0;
}